

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_apply_deviate_add(lysc_ctx *ctx,lysp_deviate_add *d,lysp_node *target)

{
  uint16_t uVar1;
  ly_ctx *plVar2;
  lysp_restr *plVar3;
  lysp_ext_instance *plVar4;
  lysp_node *plVar5;
  LY_ERR LVar6;
  uint uVar7;
  lysp_restr **pplVar8;
  char *pcVar9;
  lysp_qname *plVar10;
  undefined8 local_100;
  ulong local_e8;
  lysp_qname *local_e0;
  undefined8 local_d0;
  ulong local_b8;
  lysp_qname *local_a8;
  lysp_ext_instance *local_90;
  undefined8 *local_68;
  char *p___2;
  char *p___1;
  char *p__;
  lysp_restr *must;
  lysp_restr **musts;
  uint32_t *num;
  lysp_qname *qname;
  uint64_t u;
  LY_ERR ret;
  lysp_node *target_local;
  lysp_deviate_add *d_local;
  lysc_ctx *ctx_local;
  
  u._4_4_ = LY_SUCCESS;
  if (d->units != (char *)0x0) {
    if ((target->nodetype != 4) && (target->nodetype != 8)) {
      plVar2 = ctx->ctx;
      pcVar9 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",pcVar9
              ,"add","units");
      return LY_EVALID;
    }
    if (target[2].exts != (lysp_ext_instance *)0x0) {
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Invalid deviation adding \"%s\" property which already exists (with value \"%s\").",
              "units",target[2].exts);
      return LY_EVALID;
    }
    u._4_4_ = lydict_dup(ctx->ctx,d->units,(char **)&target[2].exts);
    if (u._4_4_ != LY_SUCCESS) {
      return u._4_4_;
    }
  }
  if (d->musts != (lysp_restr *)0x0) {
    pplVar8 = lysp_node_musts_p(target);
    if (pplVar8 == (lysp_restr **)0x0) {
      plVar2 = ctx->ctx;
      pcVar9 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",pcVar9
              ,"add","must");
      return LY_EVALID;
    }
    qname = (lysp_qname *)0x0;
    while( true ) {
      if (d->musts == (lysp_restr *)0x0) {
        local_90 = (lysp_ext_instance *)0x0;
      }
      else {
        local_90 = d->musts[-1].exts;
      }
      if (local_90 <= qname) break;
      if (*pplVar8 == (lysp_restr *)0x0) {
        p___1 = (char *)malloc(0x48);
        if (p___1 == (char *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_apply_deviate_add");
          return LY_EMEM;
        }
        p___1[0] = '\x01';
        p___1[1] = '\0';
        p___1[2] = '\0';
        p___1[3] = '\0';
        p___1[4] = '\0';
        p___1[5] = '\0';
        p___1[6] = '\0';
        p___1[7] = '\0';
      }
      else {
        (*pplVar8)[-1].exts = (lysp_ext_instance *)((long)&((*pplVar8)[-1].exts)->name + 1);
        p___1 = (char *)realloc(&(*pplVar8)[-1].exts,(long)(*pplVar8)[-1].exts * 0x40 + 8);
        if (p___1 == (char *)0x0) {
          (*pplVar8)[-1].exts = (lysp_ext_instance *)((long)&(*pplVar8)[-1].exts[-1].exts + 7);
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_apply_deviate_add");
          return LY_EMEM;
        }
      }
      *pplVar8 = (lysp_restr *)(p___1 + 8);
      plVar3 = *pplVar8;
      plVar4 = (*pplVar8)[-1].exts;
      memset(plVar3 + (long)((long)&plVar4[-1].exts + 7),0,0x40);
      LVar6 = lysp_restr_dup(ctx->ctx,ctx->pmod,d->musts + (long)qname,
                             plVar3 + (long)((long)&plVar4[-1].exts + 7));
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      qname = (lysp_qname *)((long)&qname->str + 1);
      u._4_4_ = LY_SUCCESS;
    }
  }
  if (d->uniques != (lysp_qname *)0x0) {
    if (target->nodetype != 0x10) {
      plVar2 = ctx->ctx;
      pcVar9 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",pcVar9
              ,"add","unique");
      return LY_EVALID;
    }
    qname = (lysp_qname *)0x0;
    while( true ) {
      if (d->uniques == (lysp_qname *)0x0) {
        local_a8 = (lysp_qname *)0x0;
      }
      else {
        local_a8 = *(lysp_qname **)&d->uniques[-1].flags;
      }
      if (local_a8 <= qname) break;
      if (target[2].parent == (lysp_node *)0x0) {
        p___2 = (char *)malloc(0x20);
        if (p___2 == (char *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_apply_deviate_add");
          return LY_EMEM;
        }
        p___2[0] = '\x01';
        p___2[1] = '\0';
        p___2[2] = '\0';
        p___2[3] = '\0';
        p___2[4] = '\0';
        p___2[5] = '\0';
        p___2[6] = '\0';
        p___2[7] = '\0';
      }
      else {
        target[2].parent[-1].exts =
             (lysp_ext_instance *)((long)&(target[2].parent[-1].exts)->name + 1);
        p___2 = (char *)realloc(&target[2].parent[-1].exts,
                                (long)target[2].parent[-1].exts * 0x18 + 8);
        if (p___2 == (char *)0x0) {
          target[2].parent[-1].exts =
               (lysp_ext_instance *)((long)&target[2].parent[-1].exts[-1].exts + 7);
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_apply_deviate_add");
          return LY_EMEM;
        }
      }
      target[2].parent = (lysp_node *)(p___2 + 8);
      plVar10 = (lysp_qname *)
                (&target[2].parent[2].ref + (long)&target[2].parent[-1].exts[-1].exts * 3);
      memset(plVar10,0,0x18);
      LVar6 = lysp_qname_dup(ctx->ctx,d->uniques + (long)qname,plVar10);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      qname = (lysp_qname *)((long)&qname->str + 1);
      u._4_4_ = LY_SUCCESS;
    }
  }
  if (d->dflts != (lysp_qname *)0x0) {
    uVar1 = target->nodetype;
    if (uVar1 == 2) {
      if (d->dflts == (lysp_qname *)0x0) {
        local_e8 = 0;
      }
      else {
        local_e8 = *(ulong *)&d->dflts[-1].flags;
      }
      if (1 < local_e8) {
        plVar2 = ctx->ctx;
        pcVar9 = lys_nodetype2str(target->nodetype);
        if (d->dflts == (lysp_qname *)0x0) {
          local_100 = 0;
        }
        else {
          local_100 = *(undefined8 *)&d->dflts[-1].flags;
        }
        ly_vlog(plVar2,(char *)0x0,LYVE_SEMANTICS,
                "Invalid %s of %s with too many (%lu) %s properties.","deviation",pcVar9,local_100,
                "default");
        return LY_EVALID;
      }
      if (target[1].next != (lysp_node *)0x0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                "Invalid deviation adding \"%s\" property which already exists (with value \"%s\")."
                ,"default",target[1].next);
        return LY_EVALID;
      }
      u._4_4_ = lysp_qname_dup(ctx->ctx,d->dflts,(lysp_qname *)&target[1].next);
    }
    else {
      if (uVar1 != 4) {
        if (uVar1 != 8) {
          plVar2 = ctx->ctx;
          pcVar9 = lys_nodetype2str(target->nodetype);
          ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
                  "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",
                  pcVar9,"add","default");
          return LY_EVALID;
        }
        qname = (lysp_qname *)0x0;
        while( true ) {
          if (d->dflts == (lysp_qname *)0x0) {
            local_e0 = (lysp_qname *)0x0;
          }
          else {
            local_e0 = *(lysp_qname **)&d->dflts[-1].flags;
          }
          if (local_e0 <= qname) break;
          if (target[3].parent == (lysp_node *)0x0) {
            local_68 = (undefined8 *)malloc(0x20);
            if (local_68 == (undefined8 *)0x0) {
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_apply_deviate_add");
              return LY_EMEM;
            }
            *local_68 = 1;
          }
          else {
            target[3].parent[-1].exts =
                 (lysp_ext_instance *)((long)&(target[3].parent[-1].exts)->name + 1);
            local_68 = (undefined8 *)
                       realloc(&target[3].parent[-1].exts,(long)target[3].parent[-1].exts * 0x18 + 8
                              );
            if (local_68 == (undefined8 *)0x0) {
              target[3].parent[-1].exts =
                   (lysp_ext_instance *)((long)&target[3].parent[-1].exts[-1].exts + 7);
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_apply_deviate_add");
              return LY_EMEM;
            }
          }
          target[3].parent = (lysp_node *)(local_68 + 1);
          plVar10 = (lysp_qname *)
                    (&target[3].parent[2].ref + (long)&target[3].parent[-1].exts[-1].exts * 3);
          memset(plVar10,0,0x18);
          LVar6 = lysp_qname_dup(ctx->ctx,d->dflts + (long)qname,plVar10);
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
          qname = (lysp_qname *)((long)&qname->str + 1);
          u._4_4_ = LY_SUCCESS;
        }
        goto LAB_00184fa8;
      }
      if (d->dflts == (lysp_qname *)0x0) {
        local_b8 = 0;
      }
      else {
        local_b8 = *(ulong *)&d->dflts[-1].flags;
      }
      if (1 < local_b8) {
        plVar2 = ctx->ctx;
        pcVar9 = lys_nodetype2str(target->nodetype);
        if (d->dflts == (lysp_qname *)0x0) {
          local_d0 = 0;
        }
        else {
          local_d0 = *(undefined8 *)&d->dflts[-1].flags;
        }
        ly_vlog(plVar2,(char *)0x0,LYVE_SEMANTICS,
                "Invalid %s of %s with too many (%lu) %s properties.","deviation",pcVar9,local_d0,
                "default");
        return LY_EVALID;
      }
      if (target[3].parent != (lysp_node *)0x0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                "Invalid deviation adding \"%s\" property which already exists (with value \"%s\")."
                ,"default",target[3].parent);
        return LY_EVALID;
      }
      u._4_4_ = lysp_qname_dup(ctx->ctx,d->dflts,(lysp_qname *)(target + 3));
    }
    if (u._4_4_ != LY_SUCCESS) {
      return u._4_4_;
    }
  }
LAB_00184fa8:
  if ((d->flags & 3) != 0) {
    uVar7 = (uint)target->nodetype;
    if (((((1 < uVar7 - 1) && (uVar7 != 4)) && (uVar7 != 8)) && ((uVar7 != 0x10 && (uVar7 != 0x20)))
        ) && (uVar7 != 0x60)) {
      plVar2 = ctx->ctx;
      pcVar9 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",pcVar9
              ,"add","config");
      return LY_EVALID;
    }
    if ((target->flags & 3) != 0) {
      pcVar9 = "false";
      if ((target->flags & 1) != 0) {
        pcVar9 = "true";
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Invalid deviation adding \"config\" property which already exists (with value \"config %s\")."
              ,pcVar9);
      return LY_EVALID;
    }
    target->flags = target->flags | d->flags & 3;
  }
  if ((d->flags & 0x60) != 0) {
    uVar1 = target->nodetype;
    if (((uVar1 != 2) && (uVar1 != 4)) && ((uVar1 != 0x20 && (uVar1 != 0x60)))) {
      plVar2 = ctx->ctx;
      pcVar9 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",pcVar9
              ,"add","mandatory");
      return LY_EVALID;
    }
    if ((target->flags & 0x60) != 0) {
      pcVar9 = "false";
      if ((target->flags & 0x20) != 0) {
        pcVar9 = "true";
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Invalid deviation adding \"mandatory\" property which already exists (with value \"mandatory %s\")."
              ,pcVar9);
      return LY_EVALID;
    }
    target->flags = target->flags | d->flags & 0x60;
  }
  if ((d->flags & 0x200) != 0) {
    if (target->nodetype == 8) {
      plVar5 = target + 3;
    }
    else {
      if (target->nodetype != 0x10) {
        plVar2 = ctx->ctx;
        pcVar9 = lys_nodetype2str(target->nodetype);
        ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
                "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",
                pcVar9,"add","min-elements");
        return LY_EVALID;
      }
      plVar5 = target + 2;
    }
    musts = (lysp_restr **)&plVar5->nodetype;
    if ((target->flags & 0x200) != 0) {
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Invalid deviation adding \"min-elements\" property which already exists (with value \"%u\")."
              ,(ulong)*(uint *)musts);
      return LY_EVALID;
    }
    *(uint32_t *)musts = d->min;
  }
  if ((d->flags & 0x400) != 0) {
    if (target->nodetype == 8) {
      plVar5 = target + 3;
    }
    else {
      if (target->nodetype != 0x10) {
        plVar2 = ctx->ctx;
        pcVar9 = lys_nodetype2str(target->nodetype);
        ly_vlog(plVar2,(char *)0x0,LYVE_REFERENCE,
                "Invalid %s of %s node - it is not possible to %s \"%s\" property.","deviation",
                pcVar9,"add","max-elements");
        return LY_EVALID;
      }
      plVar5 = target + 2;
    }
    musts = (lysp_restr **)&plVar5->field_0xc;
    if ((target->flags & 0x400) == 0) {
      *(uint32_t *)musts = d->max;
    }
    else {
      if (*(int *)musts == 0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                "Invalid deviation adding \"max-elements\" property which already exists (with value \"unbounded\")."
               );
      }
      else {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                "Invalid deviation adding \"max-elements\" property which already exists (with value \"%u\")."
                ,(ulong)*(uint *)musts);
      }
      u._4_4_ = LY_EVALID;
    }
  }
  return u._4_4_;
}

Assistant:

static LY_ERR
lys_apply_deviate_add(struct lysc_ctx *ctx, struct lysp_deviate_add *d, struct lysp_node *target)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_qname *qname;
    uint32_t *num;
    struct lysp_restr **musts, *must;

#define DEV_CHECK_NONPRESENCE(TYPE, MEMBER, PROPERTY, VALUEMEMBER) \
    if (((TYPE)target)->MEMBER) { \
        LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid deviation adding \"%s\" property which already exists (with value \"%s\").", \
                PROPERTY, ((TYPE)target)->VALUEMEMBER); \
        ret = LY_EVALID; \
        goto cleanup; \
    }

    /* [units-stmt] */
    if (d->units) {
        switch (target->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            break;
        default:
            AMEND_WRONG_NODETYPE("deviation", "add", "units");
        }

        DEV_CHECK_NONPRESENCE(struct lysp_node_leaf *, units, "units", units);
        DUP_STRING_GOTO(ctx->ctx, d->units, ((struct lysp_node_leaf *)target)->units, ret, cleanup);
    }

    /* *must-stmt */
    if (d->musts) {
        musts = lysp_node_musts_p(target);
        if (!musts) {
            AMEND_WRONG_NODETYPE("deviation", "add", "must");
        }

        LY_ARRAY_FOR(d->musts, u) {
            LY_ARRAY_NEW_GOTO(ctx->ctx, *musts, must, ret, cleanup);
            LY_CHECK_GOTO(ret = lysp_restr_dup(ctx->ctx, ctx->pmod, &d->musts[u], must), cleanup);
        }
    }

    /* *unique-stmt */
    if (d->uniques) {
        if (target->nodetype != LYS_LIST) {
            AMEND_WRONG_NODETYPE("deviation", "add", "unique");
        }

        LY_ARRAY_FOR(d->uniques, u) {
            LY_ARRAY_NEW_GOTO(ctx->ctx, ((struct lysp_node_list *)target)->uniques, qname, ret, cleanup);
            LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &d->uniques[u], qname), cleanup);
        }
    }

    /* *default-stmt */
    if (d->dflts) {
        switch (target->nodetype) {
        case LYS_LEAF:
            AMEND_CHECK_CARDINALITY(d->dflts, 1, "deviation", "default");
            DEV_CHECK_NONPRESENCE(struct lysp_node_leaf *, dflt.str, "default", dflt.str);

            LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &d->dflts[0], &((struct lysp_node_leaf *)target)->dflt), cleanup);
            break;
        case LYS_LEAFLIST:
            LY_ARRAY_FOR(d->dflts, u) {
                LY_ARRAY_NEW_GOTO(ctx->ctx, ((struct lysp_node_leaflist *)target)->dflts, qname, ret, cleanup);
                LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &d->dflts[u], qname), cleanup);
            }
            break;
        case LYS_CHOICE:
            AMEND_CHECK_CARDINALITY(d->dflts, 1, "deviation", "default");
            DEV_CHECK_NONPRESENCE(struct lysp_node_choice *, dflt.str, "default", dflt.str);

            LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &d->dflts[0], &((struct lysp_node_choice *)target)->dflt), cleanup);
            break;
        default:
            AMEND_WRONG_NODETYPE("deviation", "add", "default");
        }
    }

    /* [config-stmt] */
    if (d->flags & LYS_CONFIG_MASK) {
        switch (target->nodetype) {
        case LYS_CONTAINER:
        case LYS_LEAF:
        case LYS_LEAFLIST:
        case LYS_LIST:
        case LYS_CHOICE:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            break;
        default:
            AMEND_WRONG_NODETYPE("deviation", "add", "config");
        }

        if (target->flags & LYS_CONFIG_MASK) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid deviation adding \"config\" property which already exists (with value \"config %s\").",
                    target->flags & LYS_CONFIG_W ? "true" : "false");
            ret = LY_EVALID;
            goto cleanup;
        }

        target->flags |= d->flags & LYS_CONFIG_MASK;
    }

    /* [mandatory-stmt] */
    if (d->flags & LYS_MAND_MASK) {
        switch (target->nodetype) {
        case LYS_LEAF:
        case LYS_CHOICE:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            break;
        default:
            AMEND_WRONG_NODETYPE("deviation", "add", "mandatory");
        }

        if (target->flags & LYS_MAND_MASK) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid deviation adding \"mandatory\" property which already exists (with value \"mandatory %s\").",
                    target->flags & LYS_MAND_TRUE ? "true" : "false");
            ret = LY_EVALID;
            goto cleanup;
        }

        target->flags |= d->flags & LYS_MAND_MASK;
    }

    /* [min-elements-stmt] */
    if (d->flags & LYS_SET_MIN) {
        switch (target->nodetype) {
        case LYS_LEAFLIST:
            num = &((struct lysp_node_leaflist *)target)->min;
            break;
        case LYS_LIST:
            num = &((struct lysp_node_list *)target)->min;
            break;
        default:
            AMEND_WRONG_NODETYPE("deviation", "add", "min-elements");
        }

        if (target->flags & LYS_SET_MIN) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid deviation adding \"min-elements\" property which already exists (with value \"%" PRIu32 "\").",
                    *num);
            ret = LY_EVALID;
            goto cleanup;
        }

        *num = d->min;
    }

    /* [max-elements-stmt] */
    if (d->flags & LYS_SET_MAX) {
        switch (target->nodetype) {
        case LYS_LEAFLIST:
            num = &((struct lysp_node_leaflist *)target)->max;
            break;
        case LYS_LIST:
            num = &((struct lysp_node_list *)target)->max;
            break;
        default:
            AMEND_WRONG_NODETYPE("deviation", "add", "max-elements");
        }

        if (target->flags & LYS_SET_MAX) {
            if (*num) {
                LOGVAL(ctx->ctx, LYVE_REFERENCE,
                        "Invalid deviation adding \"max-elements\" property which already exists (with value \"%" PRIu32 "\").",
                        *num);
            } else {
                LOGVAL(ctx->ctx, LYVE_REFERENCE,
                        "Invalid deviation adding \"max-elements\" property which already exists (with value \"unbounded\").");
            }
            ret = LY_EVALID;
            goto cleanup;
        }

        *num = d->max;
    }

cleanup:
    return ret;
}